

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Message *pMVar2;
  Int32 *value;
  String SVar3;
  Int32 result;
  String env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStackY_48;
  Int32 local_40;
  Int32 local_3c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *in_stack_ffffffffffffffd0;
  String local_28;
  
  local_3c = default_value;
  FlagToEnvVar(in_stack_ffffffffffffffd0);
  str = getenv(local_28.c_str_);
  if (str != (char *)0x0) {
    local_40 = default_value;
    Message::Message((Message *)&local_38);
    pMVar2 = Message::operator<<((Message *)&local_38,(char (*) [22])"Environment variable ");
    pMVar2 = Message::operator<<(pMVar2,&local_28);
    value = &local_40;
    bVar1 = ParseInt32(pMVar2,str,value);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
    if (!bVar1) {
      Message::Message((Message *)&sStackY_48);
      value = &local_3c;
      Message::operator<<((Message *)&sStackY_48,value);
      SVar3 = Message::GetString((Message *)&local_38);
      printf("The default value %s is used.\n",local_38.ptr_,SVar3.length_);
      String::~String((String *)&local_38);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&sStackY_48);
      fflush(_stdout);
    }
    default_value = *value;
  }
  String::~String(&local_28);
  return default_value;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}